

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

void __thiscall
CompositedBupOutputter::newFace
          (CompositedBupOutputter *this,Image *img,Point pos,string *name,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  _Vector_base<MaskRect,_std::allocator<MaskRect>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Image::operator=(&this->withFace,&this->base);
  std::__cxx11::string::assign((char *)&this->withMouthName);
  if ((img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::operator+(&local_70,&this->baseName,"_");
    std::operator+(&local_50,&local_70,name);
    std::__cxx11::string::operator=((string *)&this->withFaceName,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)&local_88,mask);
    Image::drawOnto(img,&this->withFace,pos,(vector<MaskRect,_std::allocator<MaskRect>_> *)&local_88
                   );
    std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base(&local_88);
    return;
  }
  std::__cxx11::string::_M_assign((string *)&this->withFaceName);
  return;
}

Assistant:

void newFace(const Image& img, Point pos, const std::string& name, const std::vector<MaskRect>& mask) override {
		withFace = base;
		withMouthName = "";
		if (img.empty()) {
			withFaceName = baseName;
		} else {
			withFaceName = baseName + "_" + name;
			img.drawOnto(withFace, pos, mask);
		}
	}